

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::PrepareRenderbuffer
          (StorageMultisampleTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height,GLsizei samples)

{
  GLuint *pGVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6d0))(2,this->m_fbo);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2154);
  pGVar1 = this->m_rbo;
  (**(code **)(lVar4 + 0x3e0))(2,pGVar1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x2157);
  lVar6 = 0;
  bVar7 = false;
  while( true ) {
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo[lVar6]);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindFramebuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x215c);
    if (lVar6 == 0) {
      (**(code **)(lVar4 + 0xfb0))(pGVar1[lVar6],samples,format.internalformat,width,height);
      local_1c0.m_value = (**(code **)(lVar4 + 0x800))();
      if (local_1c0.m_value != 0) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                   ,99);
        local_1c0.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," error value. Renderbuffers format was ",0x27);
        if (format.internalformat_name == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar5 = strlen(format.internalformat_name);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,format.internalformat_name,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", samples was ",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,samples);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", height was ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ab4730;
      }
    }
    else {
      (**(code **)(lVar4 + 0xfb0))(pGVar1[lVar6],0,format.internalformat,width,height);
      local_1c0.m_value = (**(code **)(lVar4 + 0x800))();
      if (local_1c0.m_value != 0) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Renderbuffer storage multisample test failed because NamedRenderbufferStorageMultisample generated "
                   ,99);
        local_1c0.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," error value. Renderbuffers format was ",0x27);
        if (format.internalformat_name == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar5 = strlen(format.internalformat_name);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,format.internalformat_name,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", samples was ",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,", height was ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ab4730;
      }
    }
    if (((format.hasAlphaComponent | format.hasBlueComponent |
         format.hasGreenComponent | format.hasRedComponent) & 1U) != 0) {
      (**(code **)(lVar4 + 0xf10))(this->m_fbo[lVar6],0x8ce0,0x8d41,pGVar1[lVar6]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      (**(code **)(lVar4 + 0xf10))(this->m_fbo[lVar6],0x8d00,0x8d41,pGVar1[lVar6]);
    }
    if (((undefined1  [24])format & (undefined1  [24])0x10000000000) != (undefined1  [24])0x0) {
      (**(code **)(lVar4 + 0xf10))(this->m_fbo[lVar6],0x8d20,0x8d41,pGVar1[lVar6]);
    }
    local_1c0.m_value = (**(code **)(lVar4 + 0x170))(0x8d40);
    if (local_1c0.m_value != 0x8cd5) break;
    lVar6 = lVar6 + 1;
    bVar7 = lVar6 != 1;
    if (bVar7) {
      return bVar7;
    }
  }
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Renderbuffer storage multisample test failed due to ",0x34);
  local_1c0.m_getName = glu::getFramebufferStatusName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," framebuffer status. Renderbuffers format was ",0x2e);
  if (format.internalformat_name == (GLchar *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar5 = strlen(format.internalformat_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,format.internalformat_name,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", samples was ",0xe);
  iVar2 = 0;
  if (lVar6 == 0) {
    iVar2 = samples;
  }
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", width was ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", height was ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ab4730:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool StorageMultisampleTest::PrepareRenderbuffer(StorageMultisampleTest::RenderbufferInternalFormatConfiguration format,
												 glw::GLuint width, glw::GLuint height, glw::GLsizei samples)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(2, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.createRenderbuffers(2, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateRenderbuffers call failed.");

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

		if (i)
		{
			/* 2nd is not multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], 0, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << 0 << ", width was " << width << ", height was "
					<< height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}
		else
		{
			/* 1st is multisampled. */
			gl.namedRenderbufferStorageMultisample(m_rbo[i], samples, format.internalformat, width, height);

			if (glw::GLenum error = gl.getError())
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed because "
												"NamedRenderbufferStorageMultisample generated "
					<< glu::getErrorStr(error) << " error value. Renderbuffers format was "
					<< format.internalformat_name << ", samples was " << samples << ", width was " << width
					<< ", height was " << height << "." << tcu::TestLog::EndMessage;
				return false;
			}
		}

		if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasDepthComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		if (format.hasStencilComponent)
		{
			gl.namedFramebufferRenderbuffer(m_fbo[i], GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[i]);
		}

		glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Renderbuffer storage multisample test failed due to "
				<< glu::getFramebufferStatusStr(status) << " framebuffer status. Renderbuffers format was "
				<< format.internalformat_name << ", samples was " << (i ? 0 : samples) << ", width was " << width
				<< ", height was " << height << "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}